

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_glyphpath_curveTo
               (CF2_GlyphPath glyphpath,CF2_F16Dot16 x1,CF2_F16Dot16 y1,CF2_F16Dot16 x2,
               CF2_F16Dot16 y2,CF2_F16Dot16 x3,CF2_F16Dot16 y3)

{
  FT_Vector nextP1;
  FT_Vector start;
  FT_Bool FVar1;
  FT_Fast FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  FT_Vector P3;
  FT_Vector P2;
  FT_Vector P1;
  FT_Vector P0;
  int local_30;
  CF2_F16Dot16 yOffset3;
  CF2_F16Dot16 xOffset3;
  CF2_F16Dot16 yOffset1;
  CF2_F16Dot16 xOffset1;
  CF2_F16Dot16 x3_local;
  CF2_F16Dot16 y2_local;
  CF2_F16Dot16 x2_local;
  CF2_F16Dot16 y1_local;
  CF2_F16Dot16 x1_local;
  CF2_GlyphPath glyphpath_local;
  
  yOffset1 = x3;
  xOffset1 = y2;
  x3_local = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = glyphpath;
  cf2_glyphpath_computeOffset
            (glyphpath,(CF2_F16Dot16)(glyphpath->currentCS).x,(CF2_F16Dot16)(glyphpath->currentCS).y
             ,x1,y1,&xOffset3,&yOffset3);
  cf2_glyphpath_computeOffset
            (_y1_local,x3_local,xOffset1,yOffset1,y3,&local_30,(CF2_F16Dot16 *)((long)&P0.y + 4));
  iVar3 = _y1_local->callbacks->windingMomentum;
  FVar2 = cf2_getWindingMomentum(x2_local,y2_local,x3_local,xOffset1);
  _y1_local->callbacks->windingMomentum = iVar3 + FVar2;
  P1.y = (FT_Pos)((int)(_y1_local->currentCS).x + xOffset3);
  P0.x = (FT_Pos)((int)(_y1_local->currentCS).y + yOffset3);
  lVar6 = (long)(x2_local + xOffset3);
  P1.x = (FT_Pos)(y2_local + yOffset3);
  iVar3 = x3_local + local_30;
  iVar4 = xOffset1 + P0.y._4_4_;
  iVar5 = yOffset1 + local_30;
  if (_y1_local->moveIsPending != '\0') {
    start.y = P0.x;
    start.x = P1.y;
    cf2_glyphpath_pushMove(_y1_local,start);
    _y1_local->moveIsPending = '\0';
    _y1_local->pathIsOpen = '\x01';
    (_y1_local->offsetStart1).x = lVar6;
    (_y1_local->offsetStart1).y = P1.x;
  }
  if (_y1_local->elemIsQueued != '\0') {
    nextP1.y = P1.x;
    nextP1.x = lVar6;
    cf2_glyphpath_pushPrevElem(_y1_local,&_y1_local->hintMap,(FT_Vector *)&P1.y,nextP1,'\0');
  }
  _y1_local->elemIsQueued = '\x01';
  _y1_local->prevElemOp = 4;
  (_y1_local->prevElemP0).x = P1.y;
  (_y1_local->prevElemP0).y = P0.x;
  (_y1_local->prevElemP1).x = lVar6;
  (_y1_local->prevElemP1).y = P1.x;
  (_y1_local->prevElemP2).x = (long)iVar3;
  (_y1_local->prevElemP2).y = (long)iVar4;
  (_y1_local->prevElemP3).x = (long)iVar5;
  (_y1_local->prevElemP3).y = (long)(y3 + P0.y._4_4_);
  FVar1 = cf2_hintmask_isNew(_y1_local->hintMask);
  if (FVar1 != '\0') {
    cf2_hintmap_build(&_y1_local->hintMap,_y1_local->hStemHintArray,_y1_local->vStemHintArray,
                      _y1_local->hintMask,_y1_local->hintOriginY,'\0');
  }
  (_y1_local->currentCS).x = (long)yOffset1;
  (_y1_local->currentCS).y = (long)y3;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_glyphpath_curveTo( CF2_GlyphPath  glyphpath,
                         CF2_Fixed      x1,
                         CF2_Fixed      y1,
                         CF2_Fixed      x2,
                         CF2_Fixed      y2,
                         CF2_Fixed      x3,
                         CF2_Fixed      y3 )
  {
    CF2_Fixed  xOffset1, yOffset1, xOffset3, yOffset3;
    FT_Vector  P0, P1, P2, P3;


    /* TODO: ignore zero length portions of curve?? */
    cf2_glyphpath_computeOffset( glyphpath,
                                 glyphpath->currentCS.x,
                                 glyphpath->currentCS.y,
                                 x1,
                                 y1,
                                 &xOffset1,
                                 &yOffset1 );
    cf2_glyphpath_computeOffset( glyphpath,
                                 x2,
                                 y2,
                                 x3,
                                 y3,
                                 &xOffset3,
                                 &yOffset3 );

    /* add momentum from the middle segment */
    glyphpath->callbacks->windingMomentum =
      ADD_INT32( glyphpath->callbacks->windingMomentum,
                 cf2_getWindingMomentum( x1, y1, x2, y2 ) );

    /* construct offset points */
    P0.x = ADD_INT32( glyphpath->currentCS.x, xOffset1 );
    P0.y = ADD_INT32( glyphpath->currentCS.y, yOffset1 );
    P1.x = ADD_INT32( x1, xOffset1 );
    P1.y = ADD_INT32( y1, yOffset1 );
    /* note: preserve angle of final segment by using offset3 at both ends */
    P2.x = ADD_INT32( x2, xOffset3 );
    P2.y = ADD_INT32( y2, yOffset3 );
    P3.x = ADD_INT32( x3, xOffset3 );
    P3.y = ADD_INT32( y3, yOffset3 );

    if ( glyphpath->moveIsPending )
    {
      /* emit offset 1st point as MoveTo */
      cf2_glyphpath_pushMove( glyphpath, P0 );

      glyphpath->moveIsPending = FALSE;
      glyphpath->pathIsOpen    = TRUE;

      glyphpath->offsetStart1 = P1;              /* record second point */
    }

    if ( glyphpath->elemIsQueued )
    {
      FT_ASSERT( cf2_hintmap_isValid( &glyphpath->hintMap ) ||
                 glyphpath->hintMap.count == 0              );

      cf2_glyphpath_pushPrevElem( glyphpath,
                                  &glyphpath->hintMap,
                                  &P0,
                                  P1,
                                  FALSE );
    }

    /* queue the current element with offset points */
    glyphpath->elemIsQueued = TRUE;
    glyphpath->prevElemOp   = CF2_PathOpCubeTo;
    glyphpath->prevElemP0   = P0;
    glyphpath->prevElemP1   = P1;
    glyphpath->prevElemP2   = P2;
    glyphpath->prevElemP3   = P3;

    /* update current map */
    if ( cf2_hintmask_isNew( glyphpath->hintMask ) )
      cf2_hintmap_build( &glyphpath->hintMap,
                         glyphpath->hStemHintArray,
                         glyphpath->vStemHintArray,
                         glyphpath->hintMask,
                         glyphpath->hintOriginY,
                         FALSE );

    glyphpath->currentCS.x = x3;       /* pre-offset current point */
    glyphpath->currentCS.y = y3;
  }